

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3VdbeAddParseSchemaOp(Vdbe *p,int iDb,char *zWhere,u16 p5)

{
  int local_28;
  int j;
  u16 p5_local;
  char *zWhere_local;
  int iDb_local;
  Vdbe *p_local;
  
  sqlite3VdbeAddOp4(p,0x95,iDb,0,0,zWhere,-6);
  sqlite3VdbeChangeP5(p,p5);
  for (local_28 = 0; local_28 < p->db->nDb; local_28 = local_28 + 1) {
    sqlite3VdbeUsesBtree(p,local_28);
  }
  sqlite3MayAbort(p->pParse);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeAddParseSchemaOp(Vdbe *p, int iDb, char *zWhere, u16 p5){
  int j;
  sqlite3VdbeAddOp4(p, OP_ParseSchema, iDb, 0, 0, zWhere, P4_DYNAMIC);
  sqlite3VdbeChangeP5(p, p5);
  for(j=0; j<p->db->nDb; j++) sqlite3VdbeUsesBtree(p, j);
  sqlite3MayAbort(p->pParse);
}